

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::FunctionReturnVisitor::visit(FunctionReturnVisitor *this,Generator *generator)

{
  char cVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  StmtException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong uVar4;
  basic_string_view<char> bVar5;
  string_view format_str;
  format_args args;
  undefined1 local_f0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  functions;
  Stmt *local_b8;
  undefined8 uStack_b0;
  const_iterator local_98;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmts;
  undefined1 local_68 [16];
  code *local_58;
  code *local_50;
  undefined1 local_40 [8];
  shared_ptr<kratos::FunctionStmtBlock> func;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
              *)local_f0,&(generator->funcs_)._M_t);
  p_Var3 = functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (p_Var3 == (_Rb_tree_node_base *)&functions) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                   *)local_f0);
      return;
    }
    std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               (__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2));
    cVar1 = (**(code **)(*(long *)local_40 + 0x70))();
    if (cVar1 != '\0') {
      cVar1 = (**(code **)(*(long *)local_40 + 0x80))();
      if (cVar1 == '\0') {
        local_68._0_8_ = (void *)0x0;
        local_68._8_8_ = 0;
        local_50 = std::
                   _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:492:17)>
                   ::_M_invoke;
        local_58 = std::
                   _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:492:17)>
                   ::_M_manager;
        bVar2 = check_stmt_condition
                          ((Stmt *)local_40,(function<bool_(kratos::Stmt_*)> *)local_68,true,true);
        std::_Function_base::~_Function_base((_Function_base *)local_68);
        if (!bVar2) {
          auStack_88 = (undefined1  [8])0x0;
          stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)auStack_88,
                     (long)(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)((long)local_40 + 200))->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start -
                     (long)(((Stmt *)((long)local_40 + 0xc0))->super_IRNode)._vptr_IRNode >> 4);
          for (uVar4 = 0;
              uVar4 < (ulong)((long)(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                       *)((long)local_40 + 200))->
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start -
                              (long)(((Stmt *)((long)local_40 + 0xc0))->super_IRNode)._vptr_IRNode
                             >> 4); uVar4 = uVar4 + 1) {
            StmtBlock::get_stmt((StmtBlock *)local_68,(uint64_t)local_40);
            local_b8 = (Stmt *)local_68._0_8_;
            std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                      ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_88,&local_b8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
          }
          this_00 = (StmtException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_b8,(string *)((long)local_40 + 0xe8));
          local_98._M_current = (Stmt **)local_b8;
          uStack_90 = uStack_b0;
          bVar5 = fmt::v7::to_string_view<char,_0>
                            ("{0} does not have return statement in all control flows");
          format_str.data_ = (char *)bVar5.size_;
          format_str.size_ = 0xd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_68,(detail *)bVar5.data_,format_str,args);
          local_98._M_current = (Stmt **)auStack_88;
          functions._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          StmtException::StmtException
                    (this_00,(string *)local_68,&local_98,
                     (const_iterator *)&functions._M_t._M_impl.super__Rb_tree_header._M_node_count);
          __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void visit(Generator* generator) override {
        // check all the function definitions
        auto functions = generator->functions();
        for (auto const& iter : functions) {
            auto func = iter.second;
            // check if the function has a return
            if (!func->has_return_value() || func->is_builtin()) continue;
            // build statement graph
            bool has_return = check_stmt_condition(
                func.get(),
                [](Stmt* stmt) -> bool { return stmt->type() == StatementType::Return; }, true);
            if (!has_return) {
                std::vector<Stmt*> stmts;
                stmts.reserve(func->size());
                for (uint64_t i = 0; i < func->size(); i++) {
                    stmts.emplace_back(func->get_stmt(i).get());
                }
                throw StmtException(
                    ::format("{0} does not have return statement in all control flows",
                             func->function_name()),
                    stmts.begin(), stmts.end());
            }
        }
    }